

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O3

void __thiscall
Js::InternalFrameInfo::Set
          (InternalFrameInfo *this,void *codeAddress,void *framePointer,size_t stackCheckCodeHeight,
          InternalFrameType frameType,JavascriptFunction *function,bool hasInlinedFramesOnStack,
          bool previousInterpreterFrameIsFromBailout)

{
  bool in_stack_00000008;
  bool in_stack_00000010;
  
  this->codeAddress = codeAddress;
  this->framePointer = framePointer;
  this->stackCheckCodeHeight = stackCheckCodeHeight;
  this->frameType = frameType;
  this->function = function;
  this->hasInlinedFramesOnStack = in_stack_00000008;
  this->previousInterpreterFrameIsFromBailout = in_stack_00000010;
  return;
}

Assistant:

void InternalFrameInfo::Set(
        void *codeAddress,
        void *framePointer,
        size_t stackCheckCodeHeight,
        InternalFrameType frameType,
        JavascriptFunction* function,
        bool hasInlinedFramesOnStack,
        bool previousInterpreterFrameIsFromBailout)
    {
        // We skip a jitted loop body's native frame when walking the stack and refer to the loop body's interpreter frame to get the function.
        // However, if the loop body has inlinees, to retrieve inlinee frames we need to cache some info about the loop body's native frame.
        this->codeAddress = codeAddress;
        this->framePointer = framePointer;
        this->stackCheckCodeHeight = stackCheckCodeHeight;
        this->frameType = frameType;
        this->function = function;
        this->hasInlinedFramesOnStack = hasInlinedFramesOnStack;
        this->previousInterpreterFrameIsFromBailout = previousInterpreterFrameIsFromBailout;
    }